

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveRedundantMaterials.cpp
# Opt level: O0

void __thiscall
Assimp::RemoveRedundantMatsProcess::Execute(RemoveRedundantMatsProcess *this,aiScene *pScene)

{
  aiString *this_00;
  uint uVar1;
  aiMaterial *paVar2;
  bool bVar3;
  bool bVar4;
  aiReturn aVar5;
  Logger *pLVar6;
  long lVar7;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar8;
  basic_formatter *pbVar9;
  aiMaterial **__s;
  reference rVar10;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_c98;
  string local_b20;
  aiMesh *local_b00;
  aiMesh *mesh;
  undefined1 local_af0 [4];
  uint p_1;
  aiString sz;
  uint idx;
  uint local_6d4;
  uint p;
  aiMaterial **ppcMaterials;
  _Bit_type local_6c0;
  uint local_6b8;
  uint32_t local_6b4;
  uint a;
  uint32_t me;
  _Bit_type local_6a8;
  uint local_69c;
  void *pvStack_698;
  uint i_3;
  uint32_t *aiHashes;
  uint iNewNum;
  uint i_2;
  uint *aiMappingTable;
  string local_508;
  reference local_4e8;
  int local_4d4;
  iterator iStack_4d0;
  int dummy;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c8;
  _List_node_base *local_4c0;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b8;
  iterator local_4b0;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a8;
  const_iterator it;
  char local_498 [4];
  aiString name;
  aiMaterial *mat;
  undefined1 local_88 [4];
  uint i_1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  uint local_60;
  uint i;
  allocator<bool> local_4a;
  bool local_49;
  undefined1 local_48 [8];
  vector<bool,_std::allocator<bool>_> abReferenced;
  uint unreferencedRemoved;
  uint redundantRemoved;
  aiScene *pScene_local;
  RemoveRedundantMatsProcess *this_local;
  
  pLVar6 = DefaultLogger::get();
  Logger::debug(pLVar6,"RemoveRedundantMatsProcess begin");
  abReferenced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  abReferenced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  if (pScene->mNumMaterials != 0) {
    uVar1 = pScene->mNumMaterials;
    local_49 = false;
    std::allocator<bool>::allocator(&local_4a);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)uVar1,&local_49,&local_4a);
    std::allocator<bool>::~allocator(&local_4a);
    for (local_60 = 0; local_60 < pScene->mNumMeshes; local_60 = local_60 + 1) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_48,
                          (ulong)pScene->mMeshes[local_60]->mMaterialIndex);
      strings.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = (size_t)rVar10._M_p;
      std::_Bit_reference::operator=
                ((_Bit_reference *)
                 &strings.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size,true);
    }
    lVar7 = std::__cxx11::string::length();
    if (lVar7 != 0) {
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88);
      ConvertListToStrings
                (&this->mConfigFixedMaterials,
                 (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_88);
      for (mat._4_4_ = 0; mat._4_4_ < pScene->mNumMaterials; mat._4_4_ = mat._4_4_ + 1) {
        name.data._1016_8_ = pScene->mMaterials[mat._4_4_];
        this_00 = (aiString *)((long)&it._M_node + 4);
        aiString::aiString(this_00);
        aiMaterial::Get((aiMaterial *)name.data._1016_8_,"?mat.name",0,0,this_00);
        if (it._M_node._4_4_ != 0) {
          local_4b8._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_88);
          local_4c0 = (_List_node_base *)
                      std::__cxx11::
                      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_88);
          local_4b0._M_node =
               (_List_node_base *)
               std::find<std::_List_iterator<std::__cxx11::string>,char[1024]>
                         (local_4b8,
                          (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_4c0,(char (*) [1024])local_498);
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_List_const_iterator(&local_4a8,&local_4b0);
          iStack_4d0 = std::__cxx11::
                       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_88);
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_List_const_iterator(&local_4c8,&stack0xfffffffffffffb30);
          bVar3 = std::operator!=(&local_4a8,&local_4c8);
          if (bVar3) {
            local_4d4 = 1;
            aiMaterial::AddProperty
                      ((aiMaterial *)name.data._1016_8_,&local_4d4,1,"~RRM.UniqueMaterial",0,0);
            rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)mat._4_4_);
            local_4e8 = rVar10;
            std::_Bit_reference::operator=(&local_4e8,true);
            pLVar6 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[42]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &aiMappingTable,(char (*) [42])"Found positive match in exclusion list: \'");
            pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &aiMappingTable,(char (*) [1024])local_498);
            pbVar9 = (basic_formatter *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_(pbVar8,(char (*) [2])0xa925e8);
            Formatter::basic_formatter::operator_cast_to_string(&local_508,pbVar9);
            Logger::debug(pLVar6,&local_508);
            std::__cxx11::string::~string((string *)&local_508);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *
                             )&aiMappingTable);
          }
        }
      }
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_88);
    }
    _iNewNum = operator_new__((ulong)pScene->mNumMaterials << 2);
    for (aiHashes._4_4_ = 0; aiHashes._4_4_ < pScene->mNumMaterials;
        aiHashes._4_4_ = aiHashes._4_4_ + 1) {
      *(undefined4 *)((long)_iNewNum + (ulong)aiHashes._4_4_ * 4) = 0;
    }
    aiHashes._0_4_ = 0;
    pvStack_698 = operator_new__((ulong)pScene->mNumMaterials << 2);
    for (local_69c = 0; local_69c < pScene->mNumMaterials; local_69c = local_69c + 1) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)local_69c);
      _a = rVar10;
      bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&a);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        local_6b4 = ComputeMaterialHash(pScene->mMaterials[local_69c],false);
        *(uint32_t *)((long)pvStack_698 + (ulong)local_69c * 4) = local_6b4;
        for (local_6b8 = 0; local_6b8 < local_69c; local_6b8 = local_6b8 + 1) {
          rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)local_6b8);
          local_6c0 = rVar10._M_mask;
          ppcMaterials = (aiMaterial **)rVar10._M_p;
          bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&ppcMaterials);
          bVar3 = false;
          if (bVar4) {
            bVar3 = local_6b4 == *(uint32_t *)((long)pvStack_698 + (ulong)local_6b8 * 4);
          }
          if (bVar3) {
            abReferenced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_end_of_storage._4_4_ =
                 abReferenced.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage._4_4_ + 1;
            local_6b4 = 0;
            *(undefined4 *)((long)_iNewNum + (ulong)local_69c * 4) =
                 *(undefined4 *)((long)_iNewNum + (ulong)local_6b8 * 4);
            paVar2 = pScene->mMaterials[local_69c];
            if (paVar2 != (aiMaterial *)0x0) {
              aiMaterial::~aiMaterial(paVar2);
              operator_delete(paVar2,0x10);
            }
            pScene->mMaterials[local_69c] = (aiMaterial *)0x0;
            break;
          }
        }
        if (local_6b4 != 0) {
          *(uint *)((long)_iNewNum + (ulong)local_69c * 4) = (uint)aiHashes;
          aiHashes._0_4_ = (uint)aiHashes + 1;
        }
      }
      else {
        abReferenced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)abReferenced.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage + 1;
        paVar2 = pScene->mMaterials[local_69c];
        if (paVar2 != (aiMaterial *)0x0) {
          aiMaterial::~aiMaterial(paVar2);
          operator_delete(paVar2,0x10);
        }
        pScene->mMaterials[local_69c] = (aiMaterial *)0x0;
      }
    }
    if ((uint)aiHashes != pScene->mNumMaterials) {
      if ((uint)aiHashes == 0) {
        __assert_fail("iNewNum > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/RemoveRedundantMaterials.cpp"
                      ,0xaf,"virtual void Assimp::RemoveRedundantMatsProcess::Execute(aiScene *)");
      }
      __s = (aiMaterial **)operator_new__((ulong)(uint)aiHashes << 3);
      memset(__s,0,(ulong)(uint)aiHashes << 3);
      for (local_6d4 = 0; local_6d4 < pScene->mNumMaterials; local_6d4 = local_6d4 + 1) {
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)local_6d4);
        register0x00000000 = rVar10._M_p;
        bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)(sz.data + 0x3fc));
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          sz.data._1016_4_ = *(uint *)((long)_iNewNum + (ulong)local_6d4 * 4);
          if (__s[(uint)sz.data._1016_4_] == (aiMaterial *)0x0) {
            __s[(uint)sz.data._1016_4_] = pScene->mMaterials[local_6d4];
          }
          else {
            aiString::aiString((aiString *)local_af0);
            aVar5 = aiMaterial::Get(__s[(uint)sz.data._1016_4_],"?mat.name",0,0,
                                    (aiString *)local_af0);
            if (aVar5 != aiReturn_SUCCESS) {
              local_af0 = (undefined1  [4])
                          snprintf((char *)&p_1,0x400,"JoinedMaterial_#%u",(ulong)local_6d4);
              aiMaterial::AddProperty
                        (__s[(uint)sz.data._1016_4_],(aiString *)local_af0,"?mat.name",0,0);
            }
          }
        }
      }
      for (mesh._4_4_ = 0; mesh._4_4_ < pScene->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
        local_b00 = pScene->mMeshes[mesh._4_4_];
        if (local_b00 == (aiMesh *)0x0) {
          __assert_fail("__null!=mesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/RemoveRedundantMaterials.cpp"
                        ,200,"virtual void Assimp::RemoveRedundantMatsProcess::Execute(aiScene *)");
        }
        local_b00->mMaterialIndex = *(uint *)((long)_iNewNum + (ulong)local_b00->mMaterialIndex * 4)
        ;
      }
      if (pScene->mMaterials != (aiMaterial **)0x0) {
        operator_delete__(pScene->mMaterials);
      }
      pScene->mMaterials = __s;
      pScene->mNumMaterials = (uint)aiHashes;
    }
    if (pvStack_698 != (void *)0x0) {
      operator_delete__(pvStack_698);
    }
    if (_iNewNum != (void *)0x0) {
      operator_delete__(_iNewNum);
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_48);
  }
  if ((abReferenced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage._4_4_ == 0) &&
     ((int)abReferenced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage == 0)) {
    pLVar6 = DefaultLogger::get();
    Logger::debug(pLVar6,"RemoveRedundantMatsProcess finished ");
  }
  else {
    pLVar6 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[46]>
              (&local_c98,(char (*) [46])"RemoveRedundantMatsProcess finished. Removed ");
    pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_c98,
                        (uint *)((long)&abReferenced.super__Bvector_base<std::allocator<bool>_>.
                                        _M_impl.super__Bvector_impl_data._M_end_of_storage + 4));
    pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar8,(char (*) [16])" redundant and ");
    pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar8,(uint *)&abReferenced.super__Bvector_base<std::allocator<bool>_>.
                                        _M_impl.super__Bvector_impl_data._M_end_of_storage);
    pbVar9 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar8,(char (*) [19])" unused materials.");
    Formatter::basic_formatter::operator_cast_to_string(&local_b20,pbVar9);
    Logger::info(pLVar6,&local_b20);
    std::__cxx11::string::~string((string *)&local_b20);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_c98);
  }
  return;
}

Assistant:

void RemoveRedundantMatsProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("RemoveRedundantMatsProcess begin");

    unsigned int redundantRemoved = 0, unreferencedRemoved = 0;
    if (pScene->mNumMaterials)
    {
        // Find out which materials are referenced by meshes
        std::vector<bool> abReferenced(pScene->mNumMaterials,false);
        for (unsigned int i = 0;i < pScene->mNumMeshes;++i)
            abReferenced[pScene->mMeshes[i]->mMaterialIndex] = true;

        // If a list of materials to be excluded was given, match the list with
        // our imported materials and 'salt' all positive matches to ensure that
        // we get unique hashes later.
        if (mConfigFixedMaterials.length()) {

            std::list<std::string> strings;
            ConvertListToStrings(mConfigFixedMaterials,strings);

            for (unsigned int i = 0; i < pScene->mNumMaterials;++i) {
                aiMaterial* mat = pScene->mMaterials[i];

                aiString name;
                mat->Get(AI_MATKEY_NAME,name);

                if (name.length) {
                    std::list<std::string>::const_iterator it = std::find(strings.begin(), strings.end(), name.data);
                    if (it != strings.end()) {

                        // Our brilliant 'salt': A single material property with ~ as first
                        // character to mark it as internal and temporary.
                        const int dummy = 1;
                        ((aiMaterial*)mat)->AddProperty(&dummy,1,"~RRM.UniqueMaterial",0,0);

                        // Keep this material even if no mesh references it
                        abReferenced[i] = true;
                        ASSIMP_LOG_DEBUG_F( "Found positive match in exclusion list: \'", name.data, "\'");
                    }
                }
            }
        }

        // TODO: re-implement this algorithm to work in-place
        unsigned int *aiMappingTable = new unsigned int[pScene->mNumMaterials];
        for ( unsigned int i=0; i<pScene->mNumMaterials; i++ ) {
            aiMappingTable[ i ] = 0;
        }
        unsigned int iNewNum = 0;

        // Iterate through all materials and calculate a hash for them
        // store all hashes in a list and so a quick search whether
        // we do already have a specific hash. This allows us to
        // determine which materials are identical.
        uint32_t *aiHashes = new uint32_t[ pScene->mNumMaterials ];;
        for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
        {
            // No mesh is referencing this material, remove it.
            if (!abReferenced[i]) {
                ++unreferencedRemoved;
                delete pScene->mMaterials[i];
                pScene->mMaterials[i] = nullptr;
                continue;
            }

            // Check all previously mapped materials for a matching hash.
            // On a match we can delete this material and just make it ref to the same index.
            uint32_t me = aiHashes[i] = ComputeMaterialHash(pScene->mMaterials[i]);
            for (unsigned int a = 0; a < i;++a)
            {
                if (abReferenced[a] && me == aiHashes[a]) {
                    ++redundantRemoved;
                    me = 0;
                    aiMappingTable[i] = aiMappingTable[a];
                    delete pScene->mMaterials[i];
                    pScene->mMaterials[i] = nullptr;
                    break;
                }
            }
            // This is a new material that is referenced, add to the map.
            if (me) {
                aiMappingTable[i] = iNewNum++;
            }
        }
        // If the new material count differs from the original,
        // we need to rebuild the material list and remap mesh material indexes.
        if (iNewNum != pScene->mNumMaterials) {
            ai_assert(iNewNum > 0);
            aiMaterial** ppcMaterials = new aiMaterial*[iNewNum];
            ::memset(ppcMaterials,0,sizeof(void*)*iNewNum);
            for (unsigned int p = 0; p < pScene->mNumMaterials;++p)
            {
                // if the material is not referenced ... remove it
                if (!abReferenced[p]) {
                    continue;
                }

                // generate new names for modified materials that had no names
                const unsigned int idx = aiMappingTable[p];
                if (ppcMaterials[idx]) {
                    aiString sz;
                    if( ppcMaterials[idx]->Get(AI_MATKEY_NAME, sz) != AI_SUCCESS ) {
                        sz.length = ::ai_snprintf(sz.data,MAXLEN,"JoinedMaterial_#%u",p);
                        ((aiMaterial*)ppcMaterials[idx])->AddProperty(&sz,AI_MATKEY_NAME);
                    }
                } else {
                    ppcMaterials[idx] = pScene->mMaterials[p];
                }
            }
            // update all material indices
            for (unsigned int p = 0; p < pScene->mNumMeshes;++p) {
                aiMesh* mesh = pScene->mMeshes[p];
                ai_assert( NULL!=mesh );
                mesh->mMaterialIndex = aiMappingTable[mesh->mMaterialIndex];
            }
            // delete the old material list
            delete[] pScene->mMaterials;
            pScene->mMaterials = ppcMaterials;
            pScene->mNumMaterials = iNewNum;
        }
        // delete temporary storage
        delete[] aiHashes;
        delete[] aiMappingTable;
    }
    if (redundantRemoved == 0 && unreferencedRemoved == 0)
    {
        ASSIMP_LOG_DEBUG("RemoveRedundantMatsProcess finished ");
    }
    else
    {
        ASSIMP_LOG_INFO_F("RemoveRedundantMatsProcess finished. Removed ", redundantRemoved, " redundant and ", 
            unreferencedRemoved, " unused materials.");
    }
}